

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O1

MppTrieNode * mpp_trie_get_node(MppTrieNode *root,char *name)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  MppTrieNode *pMVar7;
  RK_S32 tag_len;
  RK_U64 tag_val;
  RK_S32 local_3c;
  RK_U64 local_38;
  
  local_38 = 0;
  local_3c = 0;
  if (root == (MppTrieNode *)0x0 || name == (char *)0x0) {
    pMVar7 = (MppTrieNode *)0x0;
    _mpp_log_l(2,"mpp_trie","invalid root %p name %p\n","mpp_trie_get_node",root,name);
  }
  else {
    if (((byte)mpp_trie_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_trie","root %p search %s start\n","mpp_trie_get_node",root,name);
    }
    pcVar6 = name + 1;
    uVar3 = 0;
    do {
      bVar1 = pcVar6[-1];
      cVar2 = *pcVar6;
      uVar3 = mpp_trie_walk(root + (int)uVar3,&local_38,&local_3c,(uint)(bVar1 >> 4));
      if ((int)uVar3 < 0) {
        bVar4 = false;
      }
      else {
        uVar3 = mpp_trie_walk(root + uVar3,&local_38,&local_3c,bVar1 & 0xf);
        bVar4 = -1 < (int)uVar3 && cVar2 != '\0';
      }
      pcVar6 = pcVar6 + 1;
    } while (bVar4);
    pMVar7 = (MppTrieNode *)0x0;
    if (-1 < (int)uVar3) {
      pMVar7 = root + (int)uVar3;
    }
    if (((byte)mpp_trie_debug & 4) != 0) {
      if ((int)uVar3 < 0) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = (ulong)(uint)pMVar7->id;
      }
      _mpp_log_l(4,"mpp_trie","get node %d:%d\n","mpp_trie_get_node",(ulong)uVar3,uVar5);
    }
  }
  return pMVar7;
}

Assistant:

static MppTrieNode *mpp_trie_get_node(MppTrieNode *root, const char *name)
{
    MppTrieNode *ret = NULL;
    const char *s = name;
    RK_U64 tag_val = 0;
    RK_S32 tag_len = 0;
    RK_S32 idx = 0;

    if (!root || !name) {
        mpp_err_f("invalid root %p name %p\n", root, name);
        return NULL;
    }

    trie_dbg_get("root %p search %s start\n", root, name);

    do {
        RK_U8 key = *s++;
        RK_U32 key0 = (key >> 4) & 0xf;
        RK_U32 key1 = key & 0xf;
        RK_S32 end = (s[0] == '\0');

        idx = mpp_trie_walk(&root[idx], &tag_val, &tag_len, key0);
        if (idx < 0)
            break;

        idx = mpp_trie_walk(&root[idx], &tag_val, &tag_len, key1);
        if (idx < 0 || end)
            break;
    } while (1);

    ret = (idx >= 0) ? &root[idx] : NULL;

    trie_dbg_get("get node %d:%d\n", idx, ret ? ret->id : INVALID_NODE_ID);

    return ret;
}